

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O0

void __thiscall
ktx::CommandCreate::generateMipLevels
          (CommandCreate *this,KTXTexture2 *texture,
          unique_ptr<Image,_std::default_delete<Image>_> *image,ImageInput *inputFile,
          uint32_t numMipLevels,uint32_t layerIndex,uint32_t faceIndex,uint32_t depthSliceIndex)

{
  PFNKTEXSETIMAGEFROMMEMORY p_Var1;
  bool bVar2;
  Boundary_Op BVar3;
  ktx_error_code_e kVar4;
  ktxTexture2 *pkVar5;
  pointer pIVar6;
  uint *puVar7;
  undefined8 uVar8;
  ktxTexture *pkVar9;
  size_type sVar10;
  undefined8 in_RDX;
  KTXTexture2 *in_RSI;
  long in_RDI;
  uint in_R8D;
  ktx_uint32_t in_R9D;
  float fVar11;
  int in_stack_00000008;
  int in_stack_00000010;
  ktx_error_code_e ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> imageData;
  exception *e;
  uint mipImageHeight;
  uint mipImageWidth;
  uint32_t mipLevelIndex;
  uint32_t baseHeight;
  uint32_t baseWidth;
  ImageInput *in_stack_00000620;
  VkFormat in_stack_0000062c;
  unique_ptr<Image,_std::default_delete<Image>_> *in_stack_00000630;
  CommandCreate *in_stack_00000638;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeac;
  ktx_uint32_t in_stack_fffffffffffffeb0;
  ktx_uint32_t in_stack_fffffffffffffeb4;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  uint uVar12;
  undefined4 in_stack_ffffffffffffff0c;
  uint uVar13;
  ReturnCode return_code;
  Reporter *this_00;
  VkFormat format;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  string local_a0 [32];
  undefined1 local_80 [8];
  uint local_78 [3];
  uint local_6c [3];
  uint local_60;
  uint32_t local_5c;
  uint32_t local_58;
  Reporter local_48;
  
  format = (VkFormat)((ulong)in_RDX >> 0x20);
  local_48.commandDescription._0_4_ = in_R9D;
  local_48.commandDescription._4_4_ = in_R8D;
  local_48.commandDescription.field_2._8_8_ = in_RSI;
  pkVar5 = KTXTexture2::operator->(in_RSI);
  bVar2 = isFormatINT(pkVar5->vkFormat);
  if (bVar2) {
    return_code = (ReturnCode)((ulong)(in_RDI + 8) >> 0x20);
    KTXTexture2::operator->((KTXTexture2 *)local_48.commandDescription.field_2._8_8_);
    this_00 = &local_48;
    toString_abi_cxx11_(format);
    Reporter::fatal<char_const(&)[63],std::__cxx11::string>
              (this_00,return_code,
               (char (*) [63])CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               in_stack_ffffffffffffff00);
    std::__cxx11::string::~string((string *)&local_48);
  }
  pIVar6 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                     ((unique_ptr<Image,_std::default_delete<Image>_> *)0x1e0cb3);
  local_58 = Image::getWidth(pIVar6);
  pIVar6 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                     ((unique_ptr<Image,_std::default_delete<Image>_> *)0x1e0ccf);
  local_5c = Image::getHeight(pIVar6);
  local_60 = 1;
  while( true ) {
    if ((uint)local_48.commandDescription._4_4_ <= local_60) {
      return;
    }
    local_6c[1] = 1;
    local_6c[0] = local_58 >> ((byte)local_60 & 0x1f);
    puVar7 = std::max<unsigned_int>(local_6c + 1,local_6c);
    local_6c[2] = *puVar7;
    local_78[1] = 1;
    local_78[0] = local_5c >> ((byte)local_60 & 0x1f);
    puVar7 = std::max<unsigned_int>(local_78 + 1,local_78);
    local_78[2] = *puVar7;
    pIVar6 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                       ((unique_ptr<Image,_std::default_delete<Image>_> *)0x1e0d8a);
    uVar12 = local_6c[2];
    uVar13 = local_78[2];
    std::optional<std::__cxx11::string>::value_or<std::__cxx11::string&>
              (in_stack_fffffffffffffeb8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    uVar8 = std::__cxx11::string::c_str();
    fVar11 = std::optional<float>::value_or<float&>
                       ((optional<float> *)
                        CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                        (float *)in_stack_fffffffffffffea0);
    BVar3 = std::optional<basisu::Resampler::Boundary_Op>::value_or<basisu::Resampler::Boundary_Op&>
                      ((optional<basisu::Resampler::Boundary_Op> *)
                       CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                       (Boundary_Op *)in_stack_fffffffffffffea0);
    (*pIVar6->_vptr_Image[0x11])
              (fVar11,local_80,pIVar6,(ulong)uVar12,(ulong)uVar13,uVar8,(ulong)BVar3);
    std::unique_ptr<Image,_std::default_delete<Image>_>::operator=
              ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffea0,
               (unique_ptr<Image,_std::default_delete<Image>_> *)
               CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffea0);
    std::__cxx11::string::~string(local_a0);
    if ((*(byte *)(in_RDI + 0x1d5) & 1) != 0) {
      pIVar6 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                         ((unique_ptr<Image,_std::default_delete<Image>_> *)0x1e0f60);
      (*pIVar6->_vptr_Image[0x14])();
    }
    convert(in_stack_00000638,in_stack_00000630,in_stack_0000062c,in_stack_00000620);
    pkVar5 = KTXTexture2::operator->((KTXTexture2 *)local_48.commandDescription.field_2._8_8_);
    p_Var1 = pkVar5->vtbl->SetImageFromMemory;
    pkVar9 = KTXTexture2::operator_cast_to_ktxTexture_
                       ((KTXTexture2 *)local_48.commandDescription.field_2._8_8_);
    in_stack_fffffffffffffeb4 = in_stack_00000008 + in_stack_00000010;
    in_stack_fffffffffffffea0 = &local_c8;
    in_stack_fffffffffffffeac = local_60;
    in_stack_fffffffffffffeb0 = local_48.commandDescription._0_4_;
    in_stack_fffffffffffffeb8 =
         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1e102c);
    sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       (in_stack_fffffffffffffea0);
    kVar4 = (*p_Var1)(pkVar9,in_stack_fffffffffffffeac,in_stack_fffffffffffffeb0,
                      in_stack_fffffffffffffeb4,(ktx_uint8_t *)in_stack_fffffffffffffeb8,sVar10);
    in_stack_fffffffffffffe9f = kVar4 == KTX_SUCCESS;
    if (!(bool)in_stack_fffffffffffffe9f) break;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    local_60 = local_60 + 1;
  }
  __assert_fail("ret == KTX_SUCCESS && \"Internal error\"",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp"
                ,0x9f7,
                "void ktx::CommandCreate::generateMipLevels(KTXTexture2 &, std::unique_ptr<Image>, ImageInput &, uint32_t, uint32_t, uint32_t, uint32_t)"
               );
}

Assistant:

void CommandCreate::generateMipLevels(KTXTexture2& texture, std::unique_ptr<Image> image, ImageInput& inputFile,
        uint32_t numMipLevels, uint32_t layerIndex, uint32_t faceIndex, uint32_t depthSliceIndex) {

    if (isFormatINT(static_cast<VkFormat>(texture->vkFormat)))
        fatal(rc::NOT_SUPPORTED, "Mipmap generation for SINT or UINT format {} is not supported.",
              toString(static_cast<VkFormat>(texture->vkFormat)));

    const auto baseWidth = image->getWidth();
    const auto baseHeight = image->getHeight();

    for (uint32_t mipLevelIndex = 1; mipLevelIndex < numMipLevels; ++mipLevelIndex) {
        const auto mipImageWidth = std::max(1u, baseWidth >> (mipLevelIndex));
        const auto mipImageHeight = std::max(1u, baseHeight >> (mipLevelIndex));

        try {
            image = image->resample(mipImageWidth, mipImageHeight,
                    options.mipmapFilter.value_or(options.defaultMipmapFilter).c_str(),
                    options.mipmapFilterScale.value_or(options.defaultMipmapFilterScale),
                    options.mipmapWrap.value_or(options.defaultMipmapWrap));
        } catch (const std::exception& e) {
            fatal(rc::RUNTIME_ERROR, "Mipmap generation failed: {}", e.what());
        }

        if (options.normalize)
            image->normalize();

        const auto imageData = convert(image, options.vkFormat, inputFile);

        const auto ret = ktxTexture_SetImageFromMemory(
                texture,
                mipLevelIndex,
                layerIndex,
                faceIndex + depthSliceIndex, // Faces and Depths are mutually exclusive, Addition is acceptable
                imageData.data(),
                imageData.size());
        assert(ret == KTX_SUCCESS && "Internal error"); (void) ret;
    }
}